

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool anon_unknown.dwarf_9e9497::Op_JitEq
               (bool *result,Value *src1Val,Value *src2Val,Var src1Var,Var src2Var,Func *func,
               bool isStrict)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  ValueInfo *pVVar6;
  ScriptContextInfo *pSVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  double value;
  bool isStrict_local;
  Func *func_local;
  Var src2Var_local;
  Var src1Var_local;
  Value *src2Val_local;
  Value *src1Val_local;
  bool *result_local;
  
  if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1a42,"(src1Val != nullptr && src2Val != nullptr)",
                       "src1Val != nullptr && src2Val != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((src1Var == (Var)0x0) || (src2Var == (Var)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1a43,"(src1Var != nullptr && src2Var != nullptr)",
                       "src1Var != nullptr && src2Var != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (src1Var == src2Var) {
    bVar2 = Js::TaggedInt::Is(src1Var);
    if (bVar2) {
      *result = true;
      result_local._7_1_ = true;
    }
    else {
      if (!isStrict) {
        pVVar6 = ::Value::GetValueInfo(src1Val);
        bVar2 = ValueType::IsNotFloat(&pVVar6->super_ValueType);
        if (bVar2) {
          *result = true;
          return true;
        }
      }
      bVar2 = Js::JavascriptNumber::Is_NoTaggedIntCheck(src1Var);
      if (bVar2) {
        value = Js::JavascriptNumber::GetValue(src1Var);
        BVar3 = Js::JavascriptNumber::IsNan(value);
        *result = (bool)((BVar3 != 0 ^ 0xffU) & 1);
        result_local._7_1_ = true;
      }
      else {
        pSVar7 = Func::GetScriptContextInfo(func);
        iVar4 = (*pSVar7->_vptr_ScriptContextInfo[2])();
        if (src1Var != (Var)CONCAT44(extraout_var,iVar4)) {
          pSVar7 = Func::GetScriptContextInfo(func);
          iVar4 = (*pSVar7->_vptr_ScriptContextInfo[3])();
          if (src1Var != (Var)CONCAT44(extraout_var_00,iVar4)) {
            pSVar7 = Func::GetScriptContextInfo(func);
            iVar4 = (**pSVar7->_vptr_ScriptContextInfo)();
            if (src1Var != (Var)CONCAT44(extraout_var_01,iVar4)) {
              pSVar7 = Func::GetScriptContextInfo(func);
              iVar4 = (*pSVar7->_vptr_ScriptContextInfo[1])();
              if (src1Var != (Var)CONCAT44(extraout_var_02,iVar4)) {
                return false;
              }
            }
          }
        }
        *result = true;
        result_local._7_1_ = true;
      }
    }
  }
  else {
    bVar2 = TryCompIntAndFloat(result,src1Var,src2Var);
    if ((bVar2) || (bVar2 = TryCompIntAndFloat(result,src2Var,src1Var), bVar2)) {
      result_local._7_1_ = true;
    }
    else {
      result_local._7_1_ = false;
    }
  }
  return result_local._7_1_;
}

Assistant:

bool Op_JitEq(bool * result, Value * src1Val, Value * src2Val, Js::Var src1Var, Js::Var src2Var, Func * func, bool isStrict)
    {
        Assert(src1Val != nullptr && src2Val != nullptr);
        Assert(src1Var != nullptr && src2Var != nullptr);

        if (src1Var == src2Var)
        {
            if (Js::TaggedInt::Is(src1Var))
            {
                *result = true;
                return true;
            }

            if (!isStrict && src1Val->GetValueInfo()->IsNotFloat())
            {
                // If the vars are equal and they are not NaN, non-strict equal returns true. Not float guarantees not NaN.
                *result = true;
                return true;
            }

#if FLOATVAR
            if (Js::JavascriptNumber::Is_NoTaggedIntCheck(src1Var))
            {
                *result = !Js::JavascriptNumber::IsNan(Js::JavascriptNumber::GetValue(src1Var));
                return true;
            }
#endif

            if (src1Var == reinterpret_cast<Js::Var>(func->GetScriptContextInfo()->GetTrueAddr()) ||
                src1Var == reinterpret_cast<Js::Var>(func->GetScriptContextInfo()->GetFalseAddr()) ||
                src1Var == reinterpret_cast<Js::Var>(func->GetScriptContextInfo()->GetNullAddr()) ||
                src1Var == reinterpret_cast<Js::Var>(func->GetScriptContextInfo()->GetUndefinedAddr()))
            {
                *result = true;
                return true;
            }

            // Other var comparisons require the runtime to prove.
            return false;
        }

#if FLOATVAR
        if (TryCompIntAndFloat(result, src1Var, src2Var) || TryCompIntAndFloat(result, src2Var, src1Var))
        {
            return true;
        }

#endif

        return false;
    }